

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall
ProblemTest_LogicalCons_Test::~ProblemTest_LogicalCons_Test(ProblemTest_LogicalCons_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ProblemTest, LogicalCons) {
  Problem p;
  mp::LogicalExpr expr = p.MakeLogicalConstant(false);
  p.AddCon(expr);
  p.AddCon(p.MakeLogicalConstant(true));
  Problem::LogicalConRange cons = p.logical_cons();
  Problem::LogicalConRange::iterator i = cons.begin();
  // Test dereference.
  EXPECT_EQ(p.logical_con(0), *i);
  // Test the arrow operator.
  EXPECT_EQ(expr, i->expr());
  // Test postincrement.
  Problem::LogicalConRange::iterator j = i++;
  EXPECT_EQ(p.logical_con(0), *j);
  EXPECT_EQ(p.logical_con(1), *i);
  EXPECT_TRUE(i != j);
  // Test preincrement.
  i = ++j;
  EXPECT_EQ(p.logical_con(1), *j);
  EXPECT_EQ(p.logical_con(1), *i);
  EXPECT_TRUE(i == j);
  // Test end.
  EXPECT_NE(i, cons.end());
  EXPECT_EQ(++i, cons.end());
  // Test invalid access.
  EXPECT_ASSERT(i->expr(), "invalid access");
  EXPECT_ASSERT(*i, "invalid access");
}